

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<kj::Own<kj::NetworkAddress>_>,_unsigned_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:62:21),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<kj::Own<kj::NetworkAddress>_>,_unsigned_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:62:21),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress>_>_> *pEVar1;
  uint *in_00;
  Promise<kj::Own<kj::NetworkAddress>_> local_5f8;
  ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress>_>_> local_5e8;
  uint *local_470;
  uint *depValue;
  ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress>_>_> local_310;
  Exception *local_198;
  Exception *depException;
  undefined1 local_180 [8];
  ExceptionOr<unsigned_int> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::Promise<kj::Own<kj::NetworkAddress>_>,_unsigned_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:62:21),_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr = (NullableValue<unsigned_int>)output;
  ExceptionOr<unsigned_int>::ExceptionOr((ExceptionOr<unsigned_int> *)local_180);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_180);
  local_198 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_180);
  if (local_198 == (Exception *)0x0) {
    local_470 = readMaybe<unsigned_int>
                          ((Maybe<unsigned_int> *)
                           ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
    if (local_470 != (uint *)0x0) {
      in_00 = mv<unsigned_int>(local_470);
      MaybeVoidCaller<unsigned_int,kj::Promise<kj::Own<kj::NetworkAddress>>>::
      apply<kj::(anonymous_namespace)::TestCase50::run()::__0>
                ((MaybeVoidCaller<unsigned_int,kj::Promise<kj::Own<kj::NetworkAddress>>> *)
                 &local_5f8,&this->func,in_00);
      handle(&local_5e8,this,&local_5f8);
      pEVar1 = ExceptionOrValue::as<kj::Promise<kj::Own<kj::NetworkAddress>>>
                         ((ExceptionOrValue *)depResult.value.ptr);
      ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress>_>_>::operator=(pEVar1,&local_5e8);
      ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress>_>_>::~ExceptionOr(&local_5e8);
      Promise<kj::Own<kj::NetworkAddress>_>::~Promise(&local_5f8);
    }
  }
  else {
    in = mv<kj::Exception>(local_198);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x28,in)
    ;
    handle(&local_310,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::Promise<kj::Own<kj::NetworkAddress>>>
                       ((ExceptionOrValue *)depResult.value.ptr);
    ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress>_>_>::operator=(pEVar1,&local_310);
    ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress>_>_>::~ExceptionOr(&local_310);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<unsigned_int>::~ExceptionOr((ExceptionOr<unsigned_int> *)local_180);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }